

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token * __thiscall punky::lex::Lexer::next_token(Token *__return_storage_ptr__,Lexer *this)

{
  undefined8 *puVar1;
  byte ch;
  bool bVar2;
  char cVar3;
  int iVar4;
  const_iterator cVar5;
  char *pcVar6;
  pointer pcVar7;
  long *plVar8;
  long lVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  Token tok;
  string ident;
  undefined1 local_4f3;
  undefined1 local_4f2;
  undefined1 local_4f1;
  TokenType local_4f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4e8;
  bool local_4c8;
  string local_4c0;
  undefined1 local_4a0 [24];
  undefined1 auStack_488 [16];
  bool local_478 [40];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_450;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_428;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_400;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_3d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_3b0;
  undefined1 local_388 [32];
  bool local_368;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_360;
  bool local_340;
  TokenType local_334 [7];
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_318;
  bool local_2f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2f0;
  bool local_2d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2c8;
  bool local_2a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2a0;
  bool local_280;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_278;
  bool local_258;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_250;
  bool local_230;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_228;
  bool local_208;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_200;
  bool local_1e0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1d8;
  bool local_1b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1b0;
  bool local_190;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_188;
  bool local_168;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_160;
  bool local_140;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_138;
  bool local_118;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_110;
  bool local_f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_e8;
  bool local_c8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_c0;
  bool local_a0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_98;
  bool local_78;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_70;
  bool local_50;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_48;
  bool local_28;
  
  skip_whitespace(this);
  local_4f0 = LeftParen;
  local_4c8 = false;
  ch = this->m_curr_char;
  if (0x7a < ch) {
    if (ch == 0x7b) {
      local_280 = false;
      punky::tok::make_token((Token *)local_4a0,LeftBrace,(TokenLiteral *)&local_2a0);
      local_4f0 = local_4a0._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4e8,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a0 + 8));
      if ((local_478[0] == true) &&
         (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
        operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
      }
      if ((local_280 == true) &&
         (local_280 = false,
         local_2a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2a0._M_value + 0x10)))
      goto LAB_00108035;
    }
    else {
      if (ch != 0x7d) goto switchD_00107436_caseD_22;
      local_2a8 = false;
      punky::tok::make_token((Token *)local_4a0,RightBrace,(TokenLiteral *)&local_2c8);
      local_4f0 = local_4a0._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4e8,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a0 + 8));
      if ((local_478[0] == true) &&
         (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
        operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
      }
      if ((local_2a8 == true) &&
         (local_2a8 = false, local_2a0._16_8_ = local_2c8._16_8_,
         local_2a0._M_value._M_dataplus._M_p = local_2c8._M_value._M_dataplus._M_p,
         local_2c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2c8._M_value + 0x10)))
      goto LAB_00108035;
    }
    goto LAB_0010803d;
  }
  switch(ch) {
  case 0x21:
    pcVar6 = (this->m_curr_it)._M_current + 1;
    if ((pcVar6 == (this->m_line)._M_dataplus._M_p + (this->m_line)._M_string_length) ||
       (*pcVar6 != '=')) {
      local_c8 = false;
      punky::tok::make_token((Token *)local_4a0,Bang,(TokenLiteral *)&local_e8);
      local_4f0 = local_4a0._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4e8,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a0 + 8));
      if ((local_478[0] == true) &&
         (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
        operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
      }
      if ((local_c8 == true) &&
         (local_c8 = false, local_2a0._16_8_ = local_e8._16_8_,
         local_2a0._M_value._M_dataplus._M_p = local_e8._M_value._M_dataplus._M_p,
         local_e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_e8._M_value + 0x10)))
      goto LAB_00108035;
    }
    else {
      (this->m_curr_it)._M_current = pcVar6;
      this->m_curr_char = *pcVar6;
      local_a0 = false;
      punky::tok::make_token((Token *)local_4a0,BangEqual,(TokenLiteral *)&local_c0);
      local_4f0 = local_4a0._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4e8,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a0 + 8));
      if ((local_478[0] == true) &&
         (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
        operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
      }
      if ((local_a0 == true) &&
         (local_a0 = false, local_2a0._16_8_ = local_c0._16_8_,
         local_2a0._M_value._M_dataplus._M_p = local_c0._M_value._M_dataplus._M_p,
         local_c0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_c0._M_value + 0x10)))
      goto LAB_00108035;
    }
    break;
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x2e:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3a:
switchD_00107436_caseD_22:
    bVar2 = utils::is_letter(ch);
    if (bVar2) {
      tokenize_identifier_abi_cxx11_(&local_4c0,this);
      if ((token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_ == '\0') &&
         (iVar4 = __cxa_guard_acquire(&token_type(std::__cxx11::string_const&)::
                                       M_KEYWORDS_abi_cxx11_), iVar4 != 0)) {
        local_334[6] = 0x19;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[3],_punky::tok::TokenType,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
                    *)local_4a0,(char (*) [3])"fn",local_334 + 6);
        local_334[5] = 0x1a;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[4],_punky::tok::TokenType,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
                    *)local_478,(char (*) [4])"let",local_334 + 5);
        local_334[4] = 0x1b;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[5],_punky::tok::TokenType,_true>
                  (&local_450,(char (*) [5])"true",local_334 + 4);
        local_334[3] = 0x1c;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[6],_punky::tok::TokenType,_true>
                  (&local_428,(char (*) [6])"false",local_334 + 3);
        local_334[2] = 0x1d;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[3],_punky::tok::TokenType,_true>
                  (&local_400,(char (*) [3])"if",local_334 + 2);
        local_334[1] = 0x1e;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[5],_punky::tok::TokenType,_true>
                  (&local_3d8,(char (*) [5])"else",local_334 + 1);
        local_334[0] = Return;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[7],_punky::tok::TokenType,_true>
                  (&local_3b0,(char (*) [7])"return",local_334);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,punky::tok::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,punky::tok::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_Hashtable<std::pair<std::__cxx11::string_const,punky::tok::TokenType>const*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,punky::tok::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,punky::tok::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_,local_4a0,
                   local_388,0,&local_4f1,&local_4f2,&local_4f3);
        lVar9 = -0x118;
        paVar10 = &local_3b0.first.field_2;
        do {
          if (paVar10 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar10->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar10->_M_allocated_capacity)[-2],
                            paVar10->_M_allocated_capacity + 1);
          }
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar10->_M_allocated_capacity + -5);
          lVar9 = lVar9 + 0x28;
        } while (lVar9 != 0);
        __cxa_atexit(std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>_>_>
                     ::~unordered_map,token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_
                     ,&__dso_handle);
        __cxa_guard_release(&token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_);
      }
      cVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_,&local_4c0);
      if ((cVar5.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_true>
           ._M_cur == (__node_type *)0x0) ||
         (*(TokenType *)
           ((long)cVar5.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_true>
                  ._M_cur + 0x28) == Identifier)) {
        plVar8 = (long *)((long)&local_360._M_value + 0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._M_dataplus._M_p == &local_4c0.field_2) {
          local_360._24_8_ = local_4c0.field_2._8_8_;
          local_360._M_value._M_dataplus._M_p = (_Alloc_hider)plVar8;
        }
        else {
          local_360._M_value._M_dataplus._M_p =
               (_Alloc_hider)(_Alloc_hider)local_4c0._M_dataplus._M_p;
        }
        local_360._M_value._M_string_length = local_4c0._M_string_length;
        local_4c0._M_string_length = 0;
        local_4c0.field_2._M_local_buf[0] = '\0';
        local_340 = true;
        local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
        punky::tok::make_token(__return_storage_ptr__,Identifier,(TokenLiteral *)&local_360);
        if (local_340 == true) {
          local_340 = false;
          local_48._M_value._M_dataplus._M_p = local_360._M_value._M_dataplus._M_p;
          goto LAB_00108179;
        }
      }
      else {
        local_28 = false;
        punky::tok::make_token
                  (__return_storage_ptr__,
                   *(TokenType *)
                    ((long)cVar5.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_true>
                           ._M_cur + 0x28),(TokenLiteral *)&local_48);
        if (local_28 == true) {
          plVar8 = (long *)((long)&local_48 + 0x10);
          local_28 = false;
LAB_00108179:
          if (local_48._M_value._M_dataplus._M_p != (_Alloc_hider)plVar8) {
            operator_delete((void *)local_48._M_value._M_dataplus._M_p,*plVar8 + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_dataplus._M_p == &local_4c0.field_2) goto LAB_001080ba;
      local_2f0._16_8_ =
           CONCAT71(local_4c0.field_2._M_allocated_capacity._1_7_,local_4c0.field_2._M_local_buf[0])
      ;
      local_2f0._M_value._M_dataplus._M_p = (_Alloc_hider)local_4c0._M_dataplus._M_p;
    }
    else {
      bVar2 = utils::is_digit(this->m_curr_char);
      if (!bVar2) {
        local_2f8 = false;
        punky::tok::make_token((Token *)local_4a0,Illegal,(TokenLiteral *)&local_318);
        local_4f0 = local_4a0._0_4_;
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_4e8,
                         (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_4a0 + 8));
        if ((local_478[0] == true) &&
           (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
          operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
        }
        if ((local_2f8 == true) &&
           (local_2f8 = false, local_2a0._16_8_ = local_318._16_8_,
           local_2a0._M_value._M_dataplus._M_p = local_318._M_value._M_dataplus._M_p,
           local_318._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_318._M_value + 0x10)))
        goto LAB_00108035;
        break;
      }
      tokenize_integer_abi_cxx11_((string *)local_4a0,this);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_4a0 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._0_8_ == paVar10) {
        local_388._24_8_ = auStack_488._0_8_;
        local_388._0_8_ = local_388 + 0x10;
      }
      else {
        local_388._0_8_ = local_4a0._0_8_;
      }
      local_388._17_7_ = local_4a0._17_7_;
      local_388[0x10] = local_4a0[0x10];
      local_388._8_8_ = local_4a0._8_8_;
      local_4a0._8_8_ = (pointer)0x0;
      local_4a0[0x10] = '\0';
      local_368 = true;
      local_4a0._0_8_ = paVar10;
      punky::tok::make_token(__return_storage_ptr__,Int,(TokenLiteral *)local_388);
      if ((local_368 == true) &&
         (local_368 = false, (undefined1 *)local_388._0_8_ != local_388 + 0x10)) {
        operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._0_8_ == paVar10) goto LAB_001080ba;
      local_2f0._16_8_ = CONCAT71(local_4a0._17_7_,local_4a0[0x10]);
      local_2f0._M_value._M_dataplus._M_p = (_Alloc_hider)local_4a0._0_8_;
    }
    goto LAB_00108221;
  case 0x28:
    local_208 = false;
    punky::tok::make_token((Token *)local_4a0,LeftParen,(TokenLiteral *)&local_228);
    local_4f0 = local_4a0._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4e8,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a0 + 8));
    if ((local_478[0] == true) &&
       (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
      operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
    }
    if ((local_208 == true) &&
       (local_208 = false, local_2a0._16_8_ = local_228._16_8_,
       local_2a0._M_value._M_dataplus._M_p = local_228._M_value._M_dataplus._M_p,
       local_228._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_228._M_value + 0x10))) {
LAB_00108035:
      operator_delete((void *)local_2a0._M_value._M_dataplus._M_p,local_2a0._16_8_ + 1);
    }
    break;
  case 0x29:
    local_230 = false;
    punky::tok::make_token((Token *)local_4a0,RightParen,(TokenLiteral *)&local_250);
    local_4f0 = local_4a0._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4e8,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a0 + 8));
    if ((local_478[0] == true) &&
       (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
      operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
    }
    if ((local_230 == true) &&
       (local_230 = false, local_2a0._16_8_ = local_250._16_8_,
       local_2a0._M_value._M_dataplus._M_p = local_250._M_value._M_dataplus._M_p,
       local_250._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_250._M_value + 0x10)))
    goto LAB_00108035;
    break;
  case 0x2a:
    local_168 = false;
    punky::tok::make_token((Token *)local_4a0,Asterisk,(TokenLiteral *)&local_188);
    local_4f0 = local_4a0._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4e8,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a0 + 8));
    if ((local_478[0] == true) &&
       (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
      operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
    }
    if ((local_168 == true) &&
       (local_168 = false, local_2a0._16_8_ = local_188._16_8_,
       local_2a0._M_value._M_dataplus._M_p = local_188._M_value._M_dataplus._M_p,
       local_188._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_188._M_value + 0x10)))
    goto LAB_00108035;
    break;
  case 0x2b:
    local_f0 = false;
    punky::tok::make_token((Token *)local_4a0,Plus,(TokenLiteral *)&local_110);
    local_4f0 = local_4a0._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4e8,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a0 + 8));
    if ((local_478[0] == true) &&
       (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
      operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
    }
    if ((local_f0 == true) &&
       (local_f0 = false, local_2a0._16_8_ = local_110._16_8_,
       local_2a0._M_value._M_dataplus._M_p = local_110._M_value._M_dataplus._M_p,
       local_110._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_110._M_value + 0x10)))
    goto LAB_00108035;
    break;
  case 0x2c:
    local_258 = false;
    punky::tok::make_token((Token *)local_4a0,Comma,(TokenLiteral *)&local_278);
    local_4f0 = local_4a0._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4e8,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a0 + 8));
    if ((local_478[0] == true) &&
       (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
      operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
    }
    if ((local_258 == true) &&
       (local_258 = false, local_2a0._16_8_ = local_278._16_8_,
       local_2a0._M_value._M_dataplus._M_p = local_278._M_value._M_dataplus._M_p,
       local_278._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_278._M_value + 0x10)))
    goto LAB_00108035;
    break;
  case 0x2d:
    local_118 = false;
    punky::tok::make_token((Token *)local_4a0,Minus,(TokenLiteral *)&local_138);
    local_4f0 = local_4a0._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4e8,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a0 + 8));
    if ((local_478[0] == true) &&
       (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
      operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
    }
    if ((local_118 == true) &&
       (local_118 = false, local_2a0._16_8_ = local_138._16_8_,
       local_2a0._M_value._M_dataplus._M_p = local_138._M_value._M_dataplus._M_p,
       local_138._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_138._M_value + 0x10)))
    goto LAB_00108035;
    break;
  case 0x2f:
    local_140 = false;
    punky::tok::make_token((Token *)local_4a0,Slash,(TokenLiteral *)&local_160);
    local_4f0 = local_4a0._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4e8,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a0 + 8));
    if ((local_478[0] == true) &&
       (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
      operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
    }
    if ((local_140 == true) &&
       (local_140 = false, local_2a0._16_8_ = local_160._16_8_,
       local_2a0._M_value._M_dataplus._M_p = local_160._M_value._M_dataplus._M_p,
       local_160._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_160._M_value + 0x10)))
    goto LAB_00108035;
    break;
  case 0x3b:
    local_1e0 = false;
    punky::tok::make_token((Token *)local_4a0,Semicolon,(TokenLiteral *)&local_200);
    local_4f0 = local_4a0._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4e8,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a0 + 8));
    if ((local_478[0] == true) &&
       (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
      operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
    }
    if ((local_1e0 == true) &&
       (local_1e0 = false, local_2a0._16_8_ = local_200._16_8_,
       local_2a0._M_value._M_dataplus._M_p = local_200._M_value._M_dataplus._M_p,
       local_200._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_200._M_value + 0x10)))
    goto LAB_00108035;
    break;
  case 0x3c:
    local_190 = false;
    punky::tok::make_token((Token *)local_4a0,Less,(TokenLiteral *)&local_1b0);
    local_4f0 = local_4a0._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4e8,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a0 + 8));
    if ((local_478[0] == true) &&
       (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
      operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
    }
    if ((local_190 == true) &&
       (local_190 = false, local_2a0._16_8_ = local_1b0._16_8_,
       local_2a0._M_value._M_dataplus._M_p = local_1b0._M_value._M_dataplus._M_p,
       local_1b0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1b0._M_value + 0x10)))
    goto LAB_00108035;
    break;
  case 0x3d:
    pcVar6 = (this->m_curr_it)._M_current + 1;
    if ((pcVar6 == (this->m_line)._M_dataplus._M_p + (this->m_line)._M_string_length) ||
       (*pcVar6 != '=')) {
      local_78 = false;
      punky::tok::make_token((Token *)local_4a0,Equal,(TokenLiteral *)&local_98);
      local_4f0 = local_4a0._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4e8,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a0 + 8));
      if ((local_478[0] == true) &&
         (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
        operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
      }
      if ((local_78 == true) &&
         (local_78 = false, local_2a0._16_8_ = local_98._16_8_,
         local_2a0._M_value._M_dataplus._M_p = local_98._M_value._M_dataplus._M_p,
         local_98._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_98._M_value + 0x10)))
      goto LAB_00108035;
    }
    else {
      (this->m_curr_it)._M_current = pcVar6;
      this->m_curr_char = *pcVar6;
      local_50 = false;
      punky::tok::make_token((Token *)local_4a0,EqualEqual,(TokenLiteral *)&local_70);
      local_4f0 = local_4a0._0_4_;
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_4e8,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_4a0 + 8));
      if ((local_478[0] == true) &&
         (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
        operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
      }
      if ((local_50 == true) &&
         (local_50 = false, local_2a0._16_8_ = local_70._16_8_,
         local_2a0._M_value._M_dataplus._M_p = local_70._M_value._M_dataplus._M_p,
         local_70._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_70._M_value + 0x10)))
      goto LAB_00108035;
    }
    break;
  case 0x3e:
    local_1b8 = false;
    punky::tok::make_token((Token *)local_4a0,Greater,(TokenLiteral *)&local_1d8);
    local_4f0 = local_4a0._0_4_;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_4e8,
                     (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_4a0 + 8));
    if ((local_478[0] == true) &&
       (local_478[0] = false, (undefined1 *)local_4a0._8_8_ != auStack_488)) {
      operator_delete((void *)local_4a0._8_8_,auStack_488._0_8_ + 1);
    }
    if ((local_1b8 == true) &&
       (local_1b8 = false, local_2a0._16_8_ = local_1d8._16_8_,
       local_2a0._M_value._M_dataplus._M_p = local_1d8._M_value._M_dataplus._M_p,
       local_1d8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1d8._M_value + 0x10)))
    goto LAB_00108035;
    break;
  default:
    if (ch != 0) goto switchD_00107436_caseD_22;
    local_2d0 = false;
    punky::tok::make_token(__return_storage_ptr__,EOS,(TokenLiteral *)&local_2f0);
    if ((local_2d0 != true) ||
       (local_2d0 = false,
       local_2f0._M_value._M_dataplus._M_p == (_Alloc_hider)((long)&local_2f0._M_value + 0x10)))
    goto LAB_001080ba;
LAB_00108221:
    operator_delete((void *)local_2f0._M_value._M_dataplus._M_p,local_2f0._16_8_ + 1);
    goto LAB_001080ba;
  }
LAB_0010803d:
  pcVar7 = (this->m_curr_it)._M_current + 1;
  if (pcVar7 == (this->m_line)._M_dataplus._M_p + (this->m_line)._M_string_length) {
    cVar3 = '\0';
  }
  else {
    (this->m_curr_it)._M_current = pcVar7;
    cVar3 = *pcVar7;
  }
  this->m_curr_char = cVar3;
  __return_storage_ptr__->m_type = local_4f0;
  (__return_storage_ptr__->m_literal).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  if (local_4c8 == true) {
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_literal).
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_literal).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload = puVar1;
    if (local_4e8._M_value._M_dataplus._M_p == (_Alloc_hider)((long)&local_4e8._M_value + 0x10)) {
      *puVar1 = CONCAT71(local_4e8._17_7_,local_4e8._16_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_literal).
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload + 0x18) = local_4e8._24_8_;
    }
    else {
      (__return_storage_ptr__->m_literal).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p = (pointer)local_4e8._M_value._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->m_literal).
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload + 0x10) = CONCAT71(local_4e8._17_7_,local_4e8._16_1_);
    }
    (__return_storage_ptr__->m_literal).
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = local_4e8._M_value._M_string_length;
    local_4e8._M_value._M_string_length = 0;
    local_4e8._16_1_ = 0;
    (__return_storage_ptr__->m_literal).
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
    local_4e8._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_4e8._M_value + 0x10);
  }
LAB_001080ba:
  if ((local_4c8 == true) &&
     (local_4c8 = false,
     local_4e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_4e8._M_value + 0x10))) {
    operator_delete((void *)local_4e8._M_value._M_dataplus._M_p,
                    CONCAT71(local_4e8._17_7_,local_4e8._16_1_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::next_token()
{
    skip_whitespace();

    auto tok = Token{};
    switch (m_curr_char)
    {
        case '=':
            if (peek().has_value() && peek().value() == '=')
            {
                consume();
                tok = make_token(TokenType::EqualEqual, std::nullopt);
            }
            else
                tok = make_token(TokenType::Equal, std::nullopt);
            break;
        case '!':
            if (peek().has_value() && peek().value() == '=')
            {
                consume();
                tok = make_token(TokenType::BangEqual, std::nullopt);
            }
            else
                tok = make_token(TokenType::Bang, std::nullopt);
            break;
        // clang-format off
        case '+': tok = make_token(TokenType::Plus, std::nullopt); break;
        case '-': tok = make_token(TokenType::Minus, std::nullopt); break;
        case '/': tok = make_token(TokenType::Slash, std::nullopt); break;
        case '*': tok = make_token(TokenType::Asterisk, std::nullopt); break;
        case '<': tok = make_token(TokenType::Less, std::nullopt); break;
        case '>': tok = make_token(TokenType::Greater, std::nullopt); break;
        case ';': tok = make_token(TokenType::Semicolon, std::nullopt); break;
        case '(': tok = make_token(TokenType::LeftParen, std::nullopt); break;
        case ')': tok = make_token(TokenType::RightParen, std::nullopt); break;
        case ',': tok = make_token(TokenType::Comma, std::nullopt); break;
        case '{': tok = make_token(TokenType::LeftBrace, std::nullopt); break;
        case '}': tok = make_token(TokenType::RightBrace, std::nullopt); break;
        case  0 : return make_token(TokenType::EOS, std::nullopt);
        // clang-format on
        default:
            if (utils::is_letter(m_curr_char))
            {
                auto       ident = tokenize_identifier();
                const auto type  = token_type(ident);
                return type == TokenType::Identifier ? make_token(type, std::move(ident))
                                                     : make_token(type, std::nullopt);
            }
            else if (utils::is_digit(m_curr_char))
                return make_token(TokenType::Int, tokenize_integer());
            else
                tok = make_token(TokenType::Illegal, std::nullopt);
            break;
    }

    consume();
    return tok;
}